

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O1

void light_pcapng_release(light_pcapng pcapng)

{
  _light_pcapng **pp_Var1;
  void *__ptr;
  uint uVar2;
  _light_pcapng *p_Var3;
  void *__ptr_00;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  p_Var3 = pcapng;
  if (pcapng != (light_pcapng)0x0) {
    do {
      uVar4 = uVar4 + 1;
      pp_Var1 = &p_Var3->next_block;
      p_Var3 = *pp_Var1;
    } while (*pp_Var1 != (_light_pcapng *)0x0);
  }
  __ptr_00 = calloc((ulong)uVar4,8);
  if (pcapng != (light_pcapng)0x0) {
    uVar2 = 0;
    do {
      *(light_pcapng *)((long)__ptr_00 + (ulong)uVar2 * 8) = pcapng;
      uVar2 = uVar2 + 1;
      pcapng = pcapng->next_block;
    } while (pcapng != (_light_pcapng *)0x0);
  }
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      __ptr = *(void **)((long)__ptr_00 + uVar5 * 8);
      __free_option(*(_light_option **)((long)__ptr + 0x10));
      free(*(void **)((long)__ptr + 8));
      free(__ptr);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  free(__ptr_00);
  return;
}

Assistant:

void light_pcapng_release(light_pcapng pcapng)
{
	light_pcapng iter = pcapng;
	uint32_t block_count = light_get_block_count(pcapng);
	light_pcapng *block_pointers = calloc(block_count, sizeof(light_pcapng));
	uint32_t i = 0;

	while (iter != NULL) {
		block_pointers[i] = iter;
		i++;
		iter = iter->next_block;
	}

	for (i = 0; i < block_count; ++i) {
		__free_option(block_pointers[i]->options);
		free(block_pointers[i]->block_body);
		free(block_pointers[i]);
	}

	free(block_pointers);
}